

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::Context::clearFilters(Context *this)

{
  pointer pvVar1;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    pvVar1 = (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->p->filters).
                       super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <=
        (ulong)uVar2) break;
    std::vector<doctest::String,_std::allocator<doctest::String>_>::clear(pvVar1 + uVar2);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void Context::clearFilters() {
    for(unsigned i = 0; i < p->filters.size(); ++i)
        p->filters[i].clear();
}